

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

Stream * rw::writeSkin(Stream *stream,int32 len,void *object,int32 offset,int32 param_5)

{
  Skin *skin_00;
  bool bVar1;
  int local_50;
  int32 i;
  bool oldFormat;
  Skin *skin;
  Geometry *geometry;
  int32 local_30;
  uint8 header [4];
  int32 param_4_local;
  int32 offset_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  local_30 = param_5;
  header = (uint8  [4])offset;
  if (*(long *)((long)object + 0x98) == 0) {
    skin_00 = *(Skin **)((long)object + (long)offset);
    bVar1 = version < 0x34000;
    geometry._4_1_ = (undefined1)skin_00->numBones;
    if (bVar1) {
      geometry._5_1_ = 0;
      geometry._6_1_ = 0;
    }
    else {
      geometry._5_1_ = (undefined1)skin_00->numUsedBones;
      geometry._6_1_ = (undefined1)skin_00->numWeights;
    }
    geometry._7_1_ = 0;
    (*stream->_vptr_Stream[3])(stream,(long)&geometry + 4,4);
    if (!bVar1) {
      (*stream->_vptr_Stream[3])(stream,skin_00->usedBones,(ulong)(uint)skin_00->numUsedBones);
    }
    (*stream->_vptr_Stream[3])
              (stream,skin_00->indices,(ulong)(uint)(*(int *)((long)object + 0x1c) << 2));
    Stream::write32(stream,skin_00->weights,*(int *)((long)object + 0x1c) << 4);
    for (local_50 = 0; local_50 < skin_00->numBones; local_50 = local_50 + 1) {
      if (bVar1) {
        Stream::writeU32(stream,0xdeaddead);
      }
      Stream::write32(stream,skin_00->inverseMatrices + (local_50 << 4),0x40);
    }
    stream_local = stream;
    if (!bVar1) {
      writeSkinSplitData(stream,skin_00);
    }
  }
  else if (**(int **)((long)object + 0x98) == 4) {
    stream_local = ps2::writeNativeSkin(stream,len,object,offset);
  }
  else if (**(int **)((long)object + 0x98) == 0xb) {
    stream_local = wdgl::writeNativeSkin(stream,len,object,offset);
  }
  else if (**(int **)((long)object + 0x98) == 5) {
    stream_local = xbox::writeNativeSkin(stream,len,object,offset);
  }
  else {
    stream_local = (Stream *)0x0;
  }
  return stream_local;
}

Assistant:

static Stream*
writeSkin(Stream *stream, int32 len, void *object, int32 offset, int32)
{
	uint8 header[4];
	Geometry *geometry = (Geometry*)object;

	if(geometry->instData){
		if(geometry->instData->platform == PLATFORM_PS2)
			return ps2::writeNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_WDGL)
			return wdgl::writeNativeSkin(stream, len, object, offset);
		else if(geometry->instData->platform == PLATFORM_XBOX)
			return xbox::writeNativeSkin(stream, len, object, offset);
		else{
			assert(0 && "unsupported native skin platform");
			return nil;
		}
	}

	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	// not sure which version introduced the new format
	bool oldFormat = version < 0x34000;
	header[0] = skin->numBones;
	if(oldFormat){
		header[1] = 0;
		header[2] = 0;
	}else{
		header[1] = skin->numUsedBones;
		header[2] = skin->numWeights;
	}
	header[3] = 0;
	stream->write8(header, 4);
	if(!oldFormat)
		stream->write8(skin->usedBones, skin->numUsedBones);
	stream->write8(skin->indices, geometry->numVertices*4);
	stream->write32(skin->weights, geometry->numVertices*16);
	for(int32 i = 0; i < skin->numBones; i++){
		if(oldFormat)
			stream->writeU32(0xdeaddead);
		stream->write32(&skin->inverseMatrices[i*16], 64);
	}

	if(!oldFormat)
		writeSkinSplitData(stream, skin);
	return stream;
}